

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhMapLoadPage(lhash_kv_engine *pEngine,lhash_bmap_page *pMap,uchar *zRaw)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong *puVar6;
  
  iVar1 = pEngine->iPageSize;
  uVar4 = (ulong)pMap->iPtr;
  if (uVar4 == 0) {
    SyBigEndianUnpack64(zRaw,&pMap->iNext);
    uVar5 = *(uint *)(zRaw + 8);
    pMap->nRec = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar4 = 0xc;
  }
  puVar6 = (ulong *)(zRaw + uVar4);
  if ((long)uVar4 < (long)iVar1 && pMap->nRec != 0) {
    uVar5 = 1;
    do {
      uVar4 = *puVar6;
      uVar2 = puVar6[1];
      iVar3 = lhMapInstallBucket(pEngine,uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                                         (uVar4 & 0xff0000000000) >> 0x18 |
                                         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
                                         (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
                                         uVar4 << 0x38,
                                 uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                                 (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                                 (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                                 (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
      if (iVar3 != 0) {
        return iVar3;
      }
      puVar6 = puVar6 + 2;
    } while ((uVar5 < pMap->nRec) && (uVar5 = uVar5 + 1, puVar6 < zRaw + iVar1));
  }
  pMap->iPtr = (short)puVar6 - (short)zRaw;
  return 0;
}

Assistant:

static int lhMapLoadPage(lhash_kv_engine *pEngine,lhash_bmap_page *pMap,const unsigned char *zRaw)
{
	const unsigned char *zEnd = &zRaw[pEngine->iPageSize];
	const unsigned char *zPtr = zRaw;
	pgno iLogic,iReal;
	sxu32 n;
	int rc;
	if( pMap->iPtr == 0 ){
		/* Read the map header */
		SyBigEndianUnpack64(zRaw,&pMap->iNext);
		zRaw += 8;
		SyBigEndianUnpack32(zRaw,&pMap->nRec);
		zRaw += 4;
	}else{
		/* Mostly page one of the database */
		zRaw += pMap->iPtr;
	}
	/* Start processing */
	for( n = 0; n < pMap->nRec ; ++n ){
		if( zRaw >= zEnd ){
			break;
		}
		/* Extract the logical and real bucket number */
		SyBigEndianUnpack64(zRaw,&iLogic);
		zRaw += 8;
		SyBigEndianUnpack64(zRaw,&iReal);
		zRaw += 8;
		/* Install the record in the map */
		rc = lhMapInstallBucket(pEngine,iLogic,iReal);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	pMap->iPtr = (sxu16)(zRaw-zPtr);
	/* All done */
	return UNQLITE_OK;
}